

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O2

void __thiscall
google::protobuf::MapReflectionTester::ReleaseLastMapsViaReflection
          (MapReflectionTester *this,Message *message)

{
  FieldDescriptor *this_00;
  ushort *puVar1;
  bool bVar2;
  Message *pMVar3;
  Message *message_00;
  pointer *__ptr;
  ulong uVar4;
  char *in_R9;
  Metadata MVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  AssertHelper local_90;
  AssertionResult gtest_ar_;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  output;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  MVar5 = Message::GetMetadata(message);
  output.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  output.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(MVar5.reflection,message,&output);
  uVar4 = 0;
  do {
    if ((ulong)((long)output.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)output.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) {
LAB_0015fb33:
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&output.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     );
      return;
    }
    this_00 = output.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar4];
    bVar2 = FieldDescriptor::is_repeated(this_00);
    if ((bVar2) && (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4) == 10))
    {
      pMVar3 = Reflection::ReleaseLast(MVar5.reflection,message,this_00);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = pMVar3 != (Message *)0x0;
      if (pMVar3 == (Message *)0x0) {
        testing::Message::Message((Message *)&local_98);
        std::operator<<((ostream *)(local_98._M_head_impl + 0x10),
                        "ReleaseLast returned nullptr for: ");
        puVar1 = (ushort *)(this_00->all_names_).payload_;
        local_40._M_len = (size_t)*puVar1;
        local_40._M_str = (char *)((long)puVar1 + ~local_40._M_len);
        message_00 = testing::Message::operator<<((Message *)&local_98,&local_40);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_60,(internal *)&gtest_ar_,(AssertionResult *)"released != nullptr","false"
                   ,"true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                   ,0x312,local_60._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_90,message_00);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        std::__cxx11::string::~string((string *)&local_60);
        if (local_98._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_98._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        goto LAB_0015fb33;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      (*(pMVar3->super_MessageLite)._vptr_MessageLite[1])(pMVar3);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void MapReflectionTester::ReleaseLastMapsViaReflection(Message* message) {
  const Reflection* reflection = message->GetReflection();

  std::vector<const FieldDescriptor*> output;
  reflection->ListFields(*message, &output);
  for (int i = 0; i < output.size(); ++i) {
    const FieldDescriptor* field = output[i];
    if (!field->is_repeated()) continue;
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) continue;

    Message* released = reflection->ReleaseLast(message, field);
    ASSERT_TRUE(released != nullptr)
        << "ReleaseLast returned nullptr for: " << field->name();
    delete released;
  }
}